

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

Matrix<double,_3,_3> __thiscall
Matrix<double,3,3>::operator*(Matrix<double,3,3> *this,Matrix<double,_3,_3> *matrix)

{
  Matrix<double,_3,_3> MVar1;
  double *pdVar2;
  ostream *poVar3;
  int row;
  int col;
  int col_00;
  double num;
  Matrix<double,_3,_3> result_;
  Matrix<double,_3,_3> local_50;
  double local_40;
  double local_38;
  
  if (matrix->rows != *(int *)(this + 4)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "you can not mutiply two matrix which the col of the first does not match the row of the second"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(-1);
  }
  local_50.data = (double *)0x0;
  local_50.rows = 3;
  local_50.cols = 3;
  local_50.data = (double *)operator_new__(0x48);
  if (0 < *(int *)this) {
    row = 0;
    do {
      if (0 < matrix->cols) {
        col = 0;
        do {
          if (*(int *)(this + 4) < 1) {
            num = 0.0;
          }
          else {
            num = 0.0;
            col_00 = 0;
            do {
              local_38 = num;
              pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)this,row,col_00);
              local_40 = *pdVar2;
              pdVar2 = Matrix<double,_3,_3>::operator()(matrix,col_00,col);
              num = local_38 + local_40 * *pdVar2;
              col_00 = col_00 + 1;
            } while (col_00 < *(int *)(this + 4));
          }
          Matrix<double,_3,_3>::SetElement(&local_50,row,col,num);
          col = col + 1;
        } while (col < matrix->cols);
      }
      row = row + 1;
    } while (row < *(int *)this);
  }
  MVar1.cols = local_50.cols;
  MVar1.rows = local_50.rows;
  MVar1.data = local_50.data;
  return MVar1;
}

Assistant:

int Matrix<Type, _0, _1>::row() const
{
    return this->rows;
}